

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Token * __thiscall Parser::nextToken(Parser *this)

{
  pointer pTVar1;
  char cVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  ulong uVar4;
  Parser *this_00;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  this_00 = (Parser *)local_48;
  uVar3 = (long)this->mTokenIndex + 1;
  this->mTokenIndex = (int)uVar3;
  pTVar1 = (this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar1 >> 4) * -0x3333333333333333;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    pTVar1 = pTVar1 + uVar3;
    (this->mCurrentToken).mType = pTVar1->mType;
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::operator=
              (&(this->mCurrentToken).mNumericValue.mChars,&(pTVar1->mNumericValue).mChars);
    (this->mCurrentToken).mNumericValue.mBase = (pTVar1->mNumericValue).mBase;
    cVar2 = pTVar1->mCharValue2;
    (this->mCurrentToken).mCharValue = pTVar1->mCharValue;
    (this->mCurrentToken).mCharValue2 = cVar2;
    std::__cxx11::string::_M_assign((string *)&(this->mCurrentToken).mIdentifier);
    return &this->mCurrentToken;
  }
  local_48._0_8_ = (CalculationEngine *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Reached end of tokens.","");
  parseError(this_00,(string *)local_48);
  if ((CalculationEngine *)local_48._0_8_ != (CalculationEngine *)&stack0xffffffffffffffc8) {
    operator_delete((void *)local_48._0_8_,(ulong)(local_38 + 1));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token& Parser::nextToken() {
	mTokenIndex++;

	if ((std::size_t)mTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	mCurrentToken = mTokens[mTokenIndex];
	return mCurrentToken;
}